

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

SubMesh * __thiscall Assimp::Ogre::Mesh::GetSubMesh(Mesh *this,size_t index)

{
  pointer ppSVar1;
  SubMesh *pSVar2;
  ulong uVar3;
  
  ppSVar1 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    if ((ulong)((long)(this->subMeshes).
                      super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3) {
      return (SubMesh *)0x0;
    }
    pSVar2 = ppSVar1[uVar3];
    uVar3 = uVar3 + 1;
  } while ((pSVar2->super_ISubMesh).index != index);
  return pSVar2;
}

Assistant:

SubMesh *Mesh::GetSubMesh( size_t index ) const
{
    for ( size_t i = 0; i < subMeshes.size(); ++i ) {
        if ( subMeshes[ i ]->index == index ) {
            return subMeshes[ i ];
        }
    }
    return 0;
}